

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat * __thiscall Mat::dot(Mat *__return_storage_ptr__,Mat *this,Mat *a)

{
  pointer p_Var1;
  pointer p_Var2;
  pointer p_Var3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  
  Mat(__return_storage_ptr__,this->r,this->c);
  uVar9 = this->c * this->r;
  if (0 < (int)uVar9) {
    p_Var1 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var2 = (a->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var3 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      uVar4 = *(ulong *)((long)p_Var1 + lVar10);
      uVar5 = *(ulong *)((long)p_Var2 + lVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar5;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar4;
      lVar6 = *(long *)((long)p_Var1 + lVar10 + 8);
      lVar7 = *(long *)((long)p_Var2 + lVar10 + 8);
      *(long *)((long)p_Var3 + lVar10) = SUB168(auVar11 * auVar8,0);
      *(ulong *)((long)p_Var3 + lVar10 + 8) =
           uVar4 * lVar7 + uVar5 * lVar6 + SUB168(auVar11 * auVar8,8);
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar9 << 4 != lVar10);
  }
  uVar9 = __return_storage_ptr__->c * __return_storage_ptr__->r;
  if (0 < (int)uVar9) {
    p_Var1 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      auVar11 = __modti3(*(undefined8 *)((long)p_Var1 + lVar10),
                         *(undefined8 *)((long)p_Var1 + lVar10 + 8),0x16345785d8a0003,0);
      auVar11 = __umodti3(auVar11._0_8_ + 0x16345785d8a0003,
                          auVar11._8_8_ + (ulong)(0xfe9cba87a275fffc < auVar11._0_8_),
                          0x16345785d8a0003);
      *(long *)((long)p_Var1 + lVar10) = auVar11._0_8_;
      *(long *)((long)p_Var1 + lVar10 + 8) = auVar11._8_8_;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar9 << 4 != lVar10);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::dot(const Mat &a) {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] * a.val[i];
    }
    ret.residual();
    return ret;
}